

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

FeatureSet * __thiscall
google::protobuf::DescriptorPool::Tables::InternFeatureSet(Tables *this,FeatureSet *features)

{
  _Alloc_hider __p;
  __uniq_ptr_impl<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
  *this_00;
  FeatureSet *pFVar1;
  _Alloc_hider local_38;
  
  MessageLite::SerializeAsString_abi_cxx11_
            ((string *)&stack0xffffffffffffffc8,(MessageLite *)features);
  this_00 = (__uniq_ptr_impl<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
             *)absl::lts_20250127::container_internal::
               raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
               ::
               operator[]<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_nullptr>
                         (&(this->feature_set_cache_).
                           super_raw_hash_map<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>_>_>_>
                          ,(key_arg<std::__cxx11::basic_string<char>_> *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  pFVar1 = (this_00->_M_t).
           super__Tuple_impl<0UL,_google::protobuf::FeatureSet_*,_std::default_delete<google::protobuf::FeatureSet>_>
           .super__Head_base<0UL,_google::protobuf::FeatureSet_*,_false>._M_head_impl;
  if (pFVar1 == (FeatureSet *)0x0) {
    std::make_unique<google::protobuf::FeatureSet,google::protobuf::FeatureSet>
              ((FeatureSet *)&stack0xffffffffffffffc8);
    __p._M_p = local_38._M_p;
    local_38._M_p = (pointer)0x0;
    std::
    __uniq_ptr_impl<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
    ::reset(this_00,(pointer)__p._M_p);
    std::
    unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>::
    ~unique_ptr((unique_ptr<google::protobuf::FeatureSet,_std::default_delete<google::protobuf::FeatureSet>_>
                 *)&stack0xffffffffffffffc8);
    pFVar1 = (this_00->_M_t).
             super__Tuple_impl<0UL,_google::protobuf::FeatureSet_*,_std::default_delete<google::protobuf::FeatureSet>_>
             .super__Head_base<0UL,_google::protobuf::FeatureSet_*,_false>._M_head_impl;
  }
  return pFVar1;
}

Assistant:

const FeatureSet* DescriptorPool::Tables::InternFeatureSet(
    FeatureSet&& features) {
  // Use the serialized feature set as the cache key.  If multiple equivalent
  // feature sets serialize to different strings, that just bloats the cache a
  // little.
  auto& result = feature_set_cache_[features.SerializeAsString()];
  if (result == nullptr) {
    result = absl::make_unique<FeatureSet>(std::move(features));
  }
  return result.get();
}